

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O0

void __thiscall NPC::Die(NPC *this,bool show)

{
  Character *pCVar1;
  Map *pMVar2;
  bool bVar3;
  pointer pNVar4;
  list<Character_*,_std::allocator<Character_*>_> *this_00;
  reference ppCVar5;
  double dVar6;
  __normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_> local_110;
  const_iterator local_108;
  NPC *local_100;
  NPC **local_f8;
  __normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_> local_f0;
  __normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_> local_e8;
  const_iterator local_e0;
  Character *local_d8;
  Character *character;
  iterator __end2;
  iterator __begin2;
  list<Character_*,_std::allocator<Character_*>_> *__range2;
  undefined1 local_a8 [8];
  PacketBuilder builder;
  iterator local_70;
  const_iterator local_68;
  NPC *local_60;
  _List_node_base *local_58;
  _List_iterator<NPC_*> local_50;
  iterator local_48;
  const_iterator local_40;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *local_38;
  unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *opponent;
  iterator __end1;
  iterator __begin1;
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  *__range1;
  bool show_local;
  NPC *this_local;
  
  if ((this->alive & 1U) != 0) {
    this->alive = false;
    this->parent = (NPC *)0x0;
    dVar6 = Timer::GetTime();
    this->dead_since = (double)(int)dVar6;
    __end1 = std::__cxx11::
             list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
             ::begin(&this->damagelist);
    opponent = (unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_> *)
               std::__cxx11::
               list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
               ::end(&this->damagelist);
    while (bVar3 = std::operator!=(&__end1,(_Self *)&opponent), bVar3) {
      local_38 = std::
                 _List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>
                 ::operator*(&__end1);
      pNVar4 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                         (local_38);
      pCVar1 = pNVar4->attacker;
      pNVar4 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                         (local_38);
      local_50._M_node =
           (_List_node_base *)
           std::begin<std::__cxx11::list<NPC*,std::allocator<NPC*>>>
                     (&pNVar4->attacker->unregister_npc);
      pNVar4 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                         (local_38);
      local_58 = (_List_node_base *)
                 std::end<std::__cxx11::list<NPC*,std::allocator<NPC*>>>
                           (&pNVar4->attacker->unregister_npc);
      local_60 = this;
      local_48._M_node =
           (_List_node_base *)
           std::remove<std::_List_iterator<NPC*>,NPC*>
                     (local_50,(_List_iterator<NPC_*>)local_58,&local_60);
      std::_List_const_iterator<NPC_*>::_List_const_iterator(&local_40,&local_48);
      pNVar4 = std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>::operator->
                         (local_38);
      local_70._M_node =
           (_List_node_base *)
           std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::end(&pNVar4->attacker->unregister_npc)
      ;
      std::_List_const_iterator<NPC_*>::_List_const_iterator(&local_68,&local_70);
      builder.add_size =
           (size_t)std::__cxx11::list<NPC_*,_std::allocator<NPC_*>_>::erase
                             (&pCVar1->unregister_npc,local_40,local_68);
      std::_List_iterator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>::
      operator++(&__end1);
    }
    std::__cxx11::
    list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
    ::clear(&this->damagelist);
    this->totaldamage = 0;
    if (show) {
      PacketBuilder::PacketBuilder((PacketBuilder *)local_a8,PACKET_NPC,PACKET_SPEC,0x12);
      PacketBuilder::AddShort((PacketBuilder *)local_a8,0);
      PacketBuilder::AddChar((PacketBuilder *)local_a8,0);
      PacketBuilder::AddShort((PacketBuilder *)local_a8,(uint)this->index);
      PacketBuilder::AddShort((PacketBuilder *)local_a8,0);
      PacketBuilder::AddShort((PacketBuilder *)local_a8,0);
      PacketBuilder::AddChar((PacketBuilder *)local_a8,(uint)this->x);
      PacketBuilder::AddChar((PacketBuilder *)local_a8,(uint)this->y);
      PacketBuilder::AddInt((PacketBuilder *)local_a8,0);
      PacketBuilder::AddThree((PacketBuilder *)local_a8,this->hp);
      this_00 = &this->map->characters;
      __end2 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(this_00);
      character = (Character *)
                  std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(this_00);
      while (bVar3 = std::operator!=(&__end2,(_Self *)&character), bVar3) {
        ppCVar5 = std::_List_iterator<Character_*>::operator*(&__end2);
        local_d8 = *ppCVar5;
        bVar3 = Character::InRange(local_d8,this);
        if (bVar3) {
          Character::Send(local_d8,(PacketBuilder *)local_a8);
        }
        std::_List_iterator<Character_*>::operator++(&__end2);
      }
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_a8);
    }
    if ((this->temporary & 1U) != 0) {
      pMVar2 = this->map;
      local_f0._M_current =
           (NPC **)std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(&this->map->npcs);
      local_f8 = (NPC **)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(&this->map->npcs);
      local_100 = this;
      local_e8 = std::
                 remove<__gnu_cxx::__normal_iterator<NPC**,std::vector<NPC*,std::allocator<NPC*>>>,NPC*>
                           (local_f0,(__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                                      )local_f8,&local_100);
      __gnu_cxx::__normal_iterator<NPC*const*,std::vector<NPC*,std::allocator<NPC*>>>::
      __normal_iterator<NPC**>
                ((__normal_iterator<NPC*const*,std::vector<NPC*,std::allocator<NPC*>>> *)&local_e0,
                 &local_e8);
      local_110._M_current =
           (NPC **)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(&this->map->npcs);
      __gnu_cxx::__normal_iterator<NPC*const*,std::vector<NPC*,std::allocator<NPC*>>>::
      __normal_iterator<NPC**>
                ((__normal_iterator<NPC*const*,std::vector<NPC*,std::allocator<NPC*>>> *)&local_108,
                 &local_110);
      std::vector<NPC_*,_std::allocator<NPC_*>_>::erase(&pMVar2->npcs,local_e0,local_108);
      if (this != (NPC *)0x0) {
        ~NPC(this);
        operator_delete(this,0x70);
      }
    }
  }
  return;
}

Assistant:

void NPC::Die(bool show)
{
	if (!this->alive)
		return;

	this->alive = false;
	this->parent = 0;
	this->dead_since = int(Timer::GetTime());

	UTIL_FOREACH_CREF(this->damagelist, opponent)
	{
		opponent->attacker->unregister_npc.erase(
			std::remove(UTIL_RANGE(opponent->attacker->unregister_npc), this),
			opponent->attacker->unregister_npc.end()
		);
	}

	this->damagelist.clear();
	this->totaldamage = 0;

	if (show)
	{
		PacketBuilder builder(PACKET_NPC, PACKET_SPEC, 18);
		builder.AddShort(0); // killer pid
		builder.AddChar(0); // killer direction
		builder.AddShort(this->index);
		builder.AddShort(0); // dropped item uid
		builder.AddShort(0); // dropped item id
		builder.AddChar(this->x);
		builder.AddChar(this->y);
		builder.AddInt(0); // dropped item amount
		builder.AddThree(this->hp); // damage

		UTIL_FOREACH(this->map->characters, character)
		{
			if (character->InRange(this))
			{
				character->Send(builder);
			}
		}
	}

	if (this->temporary)
	{
		this->map->npcs.erase(
			std::remove(this->map->npcs.begin(), this->map->npcs.end(), this),
			this->map->npcs.end()
		);

		delete this;
	}
}